

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O0

int archive_compressor_bzip2_open(archive_write_filter *f)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  size_t bpb;
  size_t bs;
  int ret;
  private_data_conflict3 *data;
  archive_write_filter *f_local;
  
  piVar1 = (int *)f->data;
  f_local._4_4_ = __archive_write_open_filter(f->next_filter);
  if (f_local._4_4_ == 0) {
    if (*(long *)(piVar1 + 0x18) == 0) {
      bpb = 0x10000;
      sVar2 = bpb;
      if (f->archive->magic == 0xb0c5c0de) {
        iVar3 = archive_write_get_bytes_per_block(f->archive);
        uVar4 = (ulong)iVar3;
        sVar2 = uVar4;
        if ((uVar4 < 0x10001) && (sVar2 = bpb, uVar4 != 0)) {
          sVar2 = 0x10000 - 0x10000U % uVar4;
        }
      }
      bpb = sVar2;
      *(size_t *)(piVar1 + 0x1a) = bpb;
      pvVar5 = malloc(*(size_t *)(piVar1 + 0x1a));
      *(void **)(piVar1 + 0x18) = pvVar5;
      if (*(long *)(piVar1 + 0x18) == 0) {
        archive_set_error(f->archive,0xc,"Can\'t allocate data for compression buffer");
        return -0x1e;
      }
    }
    memset(piVar1 + 2,0,0x50);
    *(undefined8 *)(piVar1 + 8) = *(undefined8 *)(piVar1 + 0x18);
    piVar1[10] = (int)*(undefined8 *)(piVar1 + 0x1a);
    f->write = archive_compressor_bzip2_write;
    iVar3 = BZ2_bzCompressInit((bz_stream *)(piVar1 + 2),*piVar1,0,0x1e);
    if (iVar3 == 0) {
      f->data = piVar1;
      f_local._4_4_ = 0;
    }
    else {
      archive_set_error(f->archive,-1,"Internal error initializing compression library");
      if (iVar3 == -9) {
        archive_set_error(f->archive,-1,
                          "Internal error initializing compression library: mis-compiled library");
      }
      else if (iVar3 == -3) {
        archive_set_error(f->archive,0xc,
                          "Internal error initializing compression library: out of memory");
      }
      else if (iVar3 == -2) {
        archive_set_error(f->archive,-1,
                          "Internal error initializing compression library: invalid setup parameter"
                         );
      }
      f_local._4_4_ = -0x1e;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_bzip2_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	ret = __archive_write_open_filter(f->next_filter);
	if (ret != 0)
		return (ret);

	if (data->compressed == NULL) {
		size_t bs = 65536, bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of the of bytes
			 * per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->compressed_buffer_size = bs;
		data->compressed
		    = (char *)malloc(data->compressed_buffer_size);
		if (data->compressed == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	memset(&data->stream, 0, sizeof(data->stream));
	data->stream.next_out = data->compressed;
	data->stream.avail_out = data->compressed_buffer_size;
	f->write = archive_compressor_bzip2_write;

	/* Initialize compression library */
	ret = BZ2_bzCompressInit(&(data->stream),
	    data->compression_level, 0, 30);
	if (ret == BZ_OK) {
		f->data = data;
		return (ARCHIVE_OK);
	}

	/* Library setup failed: clean up. */
	archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
	    "Internal error initializing compression library");

	/* Override the error message if we know what really went wrong. */
	switch (ret) {
	case BZ_PARAM_ERROR:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "invalid setup parameter");
		break;
	case BZ_MEM_ERROR:
		archive_set_error(f->archive, ENOMEM,
		    "Internal error initializing compression library: "
		    "out of memory");
		break;
	case BZ_CONFIG_ERROR:
		archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "mis-compiled library");
		break;
	}

	return (ARCHIVE_FATAL);

}